

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void jsonReturnString(JsonString *p,JsonParse *pParse,sqlite3_context *ctx)

{
  long *plVar1;
  byte bVar2;
  int iVar3;
  code *xDel;
  sqlite3_uint64 n;
  char *pcVar4;
  sqlite3_context *psVar5;
  
  bVar2 = p->eErr;
  if (bVar2 == 0) {
    psVar5 = p->pCtx;
    if (((ulong)psVar5->pFunc->pUserData & 8) != 0) {
      jsonReturnStringAsBlob(p);
      goto LAB_001bbe69;
    }
    if (p->bStatic == '\0') {
      iVar3 = jsonStringTerminate(p);
      if (iVar3 == 0) goto LAB_001bbe61;
      if (((pParse != (JsonParse *)0x0) && (pParse->bJsonIsRCStr == '\0')) &&
         (pParse->nBlobAlloc != 0)) {
        pcVar4 = p->zBuf;
        plVar1 = (long *)(pcVar4 + -8);
        *plVar1 = *plVar1 + 1;
        pParse->zJson = pcVar4;
        pParse->nJson = (int)p->nUsed;
        pParse->bJsonIsRCStr = '\x01';
        iVar3 = jsonCacheInsert(ctx,pParse);
        if (iVar3 == 7) goto LAB_001bbe64;
      }
      psVar5 = p->pCtx;
      pcVar4 = p->zBuf;
      *(long *)(pcVar4 + -8) = *(long *)(pcVar4 + -8) + 1;
      n = p->nUsed;
      xDel = sqlite3RCStrUnref;
    }
    else {
      pcVar4 = p->zBuf;
      n = p->nUsed;
      xDel = (_func_void_void_ptr *)0xffffffffffffffff;
    }
    sqlite3_result_text64(psVar5,pcVar4,n,xDel,'\x01');
  }
  else {
    if ((bVar2 & 1) == 0) {
      if ((bVar2 & 2) != 0) {
        psVar5 = p->pCtx;
        psVar5->isError = 1;
        sqlite3VdbeMemSetStr
                  (psVar5->pOut,"malformed JSON",-1,'\x01',(_func_void_void_ptr *)0xffffffffffffffff
                  );
      }
      goto LAB_001bbe69;
    }
LAB_001bbe61:
    ctx = p->pCtx;
LAB_001bbe64:
    sqlite3_result_error_nomem(ctx);
  }
LAB_001bbe69:
  jsonStringReset(p);
  return;
}

Assistant:

static void jsonReturnString(
  JsonString *p,            /* String to return */
  JsonParse *pParse,        /* JSONB source or NULL */
  sqlite3_context *ctx      /* Where to cache */
){
  assert( (pParse!=0)==(ctx!=0) );
  assert( ctx==0 || ctx==p->pCtx );
  if( p->eErr==0 ){
    int flags = SQLITE_PTR_TO_INT(sqlite3_user_data(p->pCtx));
    if( flags & JSON_BLOB ){
      jsonReturnStringAsBlob(p);
    }else if( p->bStatic ){
      sqlite3_result_text64(p->pCtx, p->zBuf, p->nUsed,
                            SQLITE_TRANSIENT, SQLITE_UTF8);
    }else if( jsonStringTerminate(p) ){
      if( pParse && pParse->bJsonIsRCStr==0 && pParse->nBlobAlloc>0 ){
        int rc;
        pParse->zJson = sqlite3RCStrRef(p->zBuf);
        pParse->nJson = p->nUsed;
        pParse->bJsonIsRCStr = 1;
        rc = jsonCacheInsert(ctx, pParse);
        if( rc==SQLITE_NOMEM ){
          sqlite3_result_error_nomem(ctx);
          jsonStringReset(p);
          return;
        }
      }
      sqlite3_result_text64(p->pCtx, sqlite3RCStrRef(p->zBuf), p->nUsed,
                            sqlite3RCStrUnref,
                            SQLITE_UTF8);
    }else{
      sqlite3_result_error_nomem(p->pCtx);
    }
  }else if( p->eErr & JSTRING_OOM ){
    sqlite3_result_error_nomem(p->pCtx);
  }else if( p->eErr & JSTRING_MALFORMED ){
    sqlite3_result_error(p->pCtx, "malformed JSON", -1);
  }
  jsonStringReset(p);
}